

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

void __thiscall
embree::ImageT<embree::Col4<unsigned_char>_>::ImageT
          (ImageT<embree::Col4<unsigned_char>_> *this,size_t width,size_t height,string *name)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  void *pvVar4;
  void *pvVar5;
  long in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  string *in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb8;
  Image *in_stack_ffffffffffffffc0;
  
  Image::Image(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(size_t)in_RDI,
               in_stack_ffffffffffffffa8);
  *in_RDI = &PTR__ImageT_00600688;
  uVar2 = in_RSI * in_RDX;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pvVar4 = operator_new__(uVar3);
  if (uVar2 != 0) {
    pvVar5 = pvVar4;
    do {
      pvVar5 = (void *)((long)pvVar5 + 4);
    } while (pvVar5 != (void *)((long)pvVar4 + uVar2 * 4));
  }
  in_RDI[8] = pvVar4;
  memset((void *)in_RDI[8],0,in_RSI * in_RDX * 4);
  return;
}

Assistant:

ImageT (size_t width = 0, size_t height = 0, const std::string& name = "")
      : Image(width,height,name)
    {
      data = new T[width*height];
      memset((void*)data,0,width*height*sizeof(T));
    }